

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

void __thiscall anon_func::Op::~Op(Op *this)

{
  _Manager_type p_Var1;
  
  p_Var1 = (this->last).fun_.super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->last,(_Any_data *)&this->last,__destroy_functor);
  }
  std::
  vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
  ::~vector((vector<testing::Action<void_(unsigned_short_&)>,_std::allocator<testing::Action<void_(unsigned_short_&)>_>_>
             *)this);
  return;
}

Assistant:

operator Action<R(Args...)>() const {  // NOLINT
    struct Op {
      std::vector<Action<void(NonFinalType<Args>...)>> converted;
      Action<R(Args...)> last;
      R operator()(Args... args) const {
        auto tuple_args = std::forward_as_tuple(std::forward<Args>(args)...);
        for (auto& a : converted) {
          a.Perform(tuple_args);
        }
        return last.Perform(std::move(tuple_args));
      }
    };
    return Op{Convert<Action<void(NonFinalType<Args>...)>>(
                  MakeIndexSequence<sizeof...(Actions) - 1>()),
              std::get<sizeof...(Actions) - 1>(actions)};
  }